

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::IdleDecommitPageAllocator::EnterIdleDecommit(IdleDecommitPageAllocator *this)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  ThreadContextId pvVar4;
  undefined8 *in_FS_OFFSET;
  AutoResetWaitingToEnterIdleDecommitFlag local_18;
  AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag;
  IdleDecommitPageAllocator *this_local;
  
  (this->super_PageAllocator).idleDecommitEnterCount =
       (this->super_PageAllocator).idleDecommitEnterCount + 1;
  if ((this->super_PageAllocator).idleDecommitEnterCount == 1) {
    autoResetWaitingToEnterIdleDecommitFlag.pageAllocator = this;
    bVar2 = CCLock::TryEnter(&(this->cs).super_CCLock);
    if (!bVar2) {
      AutoResetWaitingToEnterIdleDecommitFlag::AutoResetWaitingToEnterIdleDecommitFlag
                (&local_18,this);
      CCLock::Enter(&(this->cs).super_CCLock);
      AutoResetWaitingToEnterIdleDecommitFlag::~AutoResetWaitingToEnterIdleDecommitFlag(&local_18);
    }
    (this->super_PageAllocator).isUsed = false;
    this->hadDecommitTimer = (bool)(this->hasDecommitTimer & 1);
    bVar2 = Js::Phases::IsEnabled
                      (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                       PageAllocatorPhase);
    if ((bVar2) && ((((this->super_PageAllocator).pageAllocatorFlagTable)->Verbose & 1U) != 0)) {
      pvVar4 = GetCurrentThreadContextId();
      DVar3 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar4,(ulong)DVar3,this);
      if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ",(this->super_PageAllocator).debugName);
      }
      Output::Print(L"EnterIdleDecommit");
      Output::Print(L"\n");
      Output::Flush();
    }
    if ((this->hasDecommitTimer & 1U) == 0) {
      if ((this->super_PageAllocator).maxFreePageCount != this->maxNonIdleDecommitFreePageCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0x51,"(this->maxFreePageCount == maxNonIdleDecommitFreePageCount)",
                           "this->maxFreePageCount == maxNonIdleDecommitFreePageCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      if ((this->super_PageAllocator).minFreePageCount != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0x52,"(minFreePageCount == 0)","minFreePageCount == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      (this->super_PageAllocator).maxFreePageCount = this->maxIdleDecommitFreePageCount;
    }
    else {
      if ((this->super_PageAllocator).maxFreePageCount != this->maxIdleDecommitFreePageCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0x4a,"(this->maxFreePageCount == maxIdleDecommitFreePageCount)",
                           "this->maxFreePageCount == maxIdleDecommitFreePageCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      this->hasDecommitTimer = false;
      bVar2 = Js::Phases::IsEnabled
                        (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                         PageAllocatorPhase);
      if (bVar2) {
        pvVar4 = GetCurrentThreadContextId();
        DVar3 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar4,(ulong)DVar3,this);
        if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",(this->super_PageAllocator).debugName);
        }
        Output::Print(L"Cancel Decommit Timer");
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    CCLock::Leave(&(this->cs).super_CCLock);
    if ((this->hasDecommitTimer & 1U) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                         ,0x58,"(!hasDecommitTimer)","!hasDecommitTimer");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  return;
}

Assistant:

void
IdleDecommitPageAllocator::EnterIdleDecommit()
{
    this->idleDecommitEnterCount++;
    if (this->idleDecommitEnterCount != 1)
    {
        return;
    }
#ifdef IDLE_DECOMMIT_ENABLED
    if (!cs.TryEnter())
    {
        AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag(this);

#ifdef ENABLE_BASIC_TELEMETRY
        AllocatorDecommitStats * decommitStats = this->GetDecommitStats();
        decommitStats->lastEnterLeaveIdleDecommitTick = Js::Tick::Now();
#endif

        cs.Enter();

#ifdef ENABLE_BASIC_TELEMETRY
        decommitStats->lastEnterLeaveIdleDecommitCSWaitTime = Js::Tick::Now() - decommitStats->lastEnterLeaveIdleDecommitTick;
        decommitStats->totalEnterLeaveIdleDecommitCSWaitTime += decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
        if (decommitStats->lastEnterLeaveIdleDecommitCSWaitTime > decommitStats->maxEnterLeaveIdleDecommitCSWaitTime)
        {
            decommitStats->maxEnterLeaveIdleDecommitCSWaitTime = decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
        }
#endif
    }

    this->isUsed = false;
    this->hadDecommitTimer = hasDecommitTimer;
    PAGE_ALLOC_VERBOSE_TRACE(_u("EnterIdleDecommit"));
    if (hasDecommitTimer)
    {
        // Cancel the decommit timer
        Assert(this->maxFreePageCount == maxIdleDecommitFreePageCount);
        hasDecommitTimer = false;
        PAGE_ALLOC_TRACE(_u("Cancel Decommit Timer"));
    }
    else
    {
        // Switch to maxIdleDecommitFreePageCount
        Assert(this->maxFreePageCount == maxNonIdleDecommitFreePageCount);
        Assert(minFreePageCount == 0);
        this->maxFreePageCount = maxIdleDecommitFreePageCount;
    }

    cs.Leave();

    Assert(!hasDecommitTimer);
#else
    Assert(this->maxFreePageCount == maxNonIdleDecommitFreePageCount);
    this->maxFreePageCount = maxIdleDecommitFreePageCount;
#endif
}